

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::MemberInfo
          (MemberInfo *this,MemberInfo *parent,uint codeOrder,Reader *decl,StructOrGroup *fieldScope
          ,bool isInUnion)

{
  uint uVar1;
  void *pvVar2;
  SegmentReader *pSVar3;
  CapTableReader *pCVar4;
  WirePointer *pWVar5;
  StructPointerCount SVar6;
  undefined2 uVar7;
  int iVar8;
  undefined4 uVar9;
  bool bVar10;
  uint uVar11;
  ArrayPtr<const_char> AVar12;
  Reader fieldDecl;
  Fault f;
  undefined1 local_b8 [24];
  WirePointer *pWStack_a0;
  uint local_98;
  StructPointerCount SStack_94;
  undefined2 uStack_92;
  int iStack_90;
  undefined4 uStack_8c;
  Reader local_88;
  Reader local_58;
  
  this->parent = parent;
  this->codeOrder = codeOrder;
  this->index = 0;
  this->childCount = 0;
  this->childInitializedCount = 0;
  this->unionDiscriminantCount = 0;
  this->isInUnion = isInUnion;
  Declaration::Reader::getName((Reader *)local_b8,decl);
  AVar12 = (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)local_b8);
  (this->name).content = AVar12;
  pSVar3 = (decl->_reader).segment;
  pCVar4 = (decl->_reader).capTable;
  pvVar2 = (decl->_reader).data;
  pWVar5 = (decl->_reader).pointers;
  SVar6 = (decl->_reader).pointerCount;
  uVar7 = *(undefined2 *)&(decl->_reader).field_0x26;
  iVar8 = (decl->_reader).nestingLimit;
  uVar9 = *(undefined4 *)&(decl->_reader).field_0x2c;
  (this->declId)._reader.dataSize = (decl->_reader).dataSize;
  (this->declId)._reader.pointerCount = SVar6;
  *(undefined2 *)&(this->declId)._reader.field_0x26 = uVar7;
  (this->declId)._reader.nestingLimit = iVar8;
  *(undefined4 *)&(this->declId)._reader.field_0x2c = uVar9;
  (this->declId)._reader.data = pvVar2;
  (this->declId)._reader.pointers = pWVar5;
  (this->declId)._reader.segment = pSVar3;
  (this->declId)._reader.capTable = pCVar4;
  this->declKind = FIELD;
  this->isParam = false;
  this->hasDefaultValue = false;
  (this->fieldType)._reader.data = (void *)0x0;
  (this->fieldType)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldType)._reader.pointers + 6) = 0;
  (this->fieldType)._reader.segment = (SegmentReader *)0x0;
  (this->fieldType)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldType)._reader.nestingLimit = 0x7fffffff;
  (this->fieldDefaultValue)._reader.data = (void *)0x0;
  (this->fieldDefaultValue)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldDefaultValue)._reader.pointers + 6) = 0;
  (this->fieldDefaultValue)._reader.segment = (SegmentReader *)0x0;
  (this->fieldDefaultValue)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldDefaultValue)._reader.nestingLimit = 0x7fffffff;
  Declaration::Reader::getAnnotations(&this->declAnnotations,decl);
  uVar1 = (decl->_reader).dataSize;
  if (uVar1 < 0x40) {
    this->startByte = 0;
    uVar11 = 0;
  }
  else {
    pvVar2 = (decl->_reader).data;
    this->startByte = *(uint *)((long)pvVar2 + 4);
    uVar11 = 0;
    if (0x5f < uVar1) {
      uVar11 = *(uint *)((long)pvVar2 + 8);
    }
  }
  this->endByte = uVar11;
  local_b8._0_2_ = FILE;
  (this->docComment).ptr.isSet = false;
  (this->schema).ptr.isSet = false;
  (this->node)._builder.segment = (SegmentBuilder *)0x0;
  (this->node)._builder.capTable = (CapTableBuilder *)0x0;
  (this->node)._builder.data = (void *)0x0;
  (this->node)._builder.pointers = (WirePointer *)0x0;
  (this->sourceInfo)._builder.segment = (SegmentBuilder *)0x0;
  (this->sourceInfo)._builder.capTable = (CapTableBuilder *)0x0;
  (this->sourceInfo)._builder.data = (void *)0x0;
  (this->sourceInfo)._builder.pointers = (WirePointer *)0x0;
  (this->field_21).fieldScope = fieldScope;
  if (0x1f < (decl->_reader).dataSize) {
    local_b8._0_2_ = *(Which *)((long)(decl->_reader).data + 2);
  }
  local_b8._2_2_ = FIELD;
  local_b8._8_8_ = " == ";
  local_b8._16_8_ = (void *)0x5;
  pWStack_a0 = (WirePointer *)CONCAT71(pWStack_a0._1_7_,local_b8._0_2_ == FIELD);
  if (local_b8._0_2_ == FIELD) {
    local_b8._0_8_ = (decl->_reader).segment;
    local_b8._8_8_ = (decl->_reader).capTable;
    local_b8._16_8_ = (decl->_reader).data;
    pWStack_a0 = (decl->_reader).pointers;
    local_98 = (decl->_reader).dataSize;
    SStack_94 = (decl->_reader).pointerCount;
    uStack_92 = *(undefined2 *)&(decl->_reader).field_0x26;
    iStack_90 = (decl->_reader).nestingLimit;
    uStack_8c = *(undefined4 *)&(decl->_reader).field_0x2c;
    Declaration::Field::Reader::getType(&local_88,(Reader *)local_b8);
    (this->fieldType)._reader.dataSize = local_88._reader.dataSize;
    (this->fieldType)._reader.pointerCount = local_88._reader.pointerCount;
    *(undefined2 *)&(this->fieldType)._reader.field_0x26 = local_88._reader._38_2_;
    (this->fieldType)._reader.nestingLimit = local_88._reader.nestingLimit;
    *(undefined4 *)&(this->fieldType)._reader.field_0x2c = local_88._reader._44_4_;
    (this->fieldType)._reader.data = local_88._reader.data;
    (this->fieldType)._reader.pointers = local_88._reader.pointers;
    (this->fieldType)._reader.segment = local_88._reader.segment;
    (this->fieldType)._reader.capTable = local_88._reader.capTable;
    if ((0x6f < local_98) && (*(short *)(local_b8._16_8_ + 0xc) == 1)) {
      this->hasDefaultValue = true;
      local_58._reader.dataSize = local_98;
      local_58._reader.pointerCount = SStack_94;
      local_58._reader._38_2_ = uStack_92;
      local_58._reader.nestingLimit = iStack_90;
      local_58._reader._44_4_ = uStack_8c;
      local_58._reader.data = (void *)local_b8._16_8_;
      local_58._reader.pointers = pWStack_a0;
      local_58._reader.segment = (SegmentReader *)local_b8._0_8_;
      local_58._reader.capTable = (CapTableReader *)local_b8._8_8_;
      Declaration::Field::DefaultValue::Reader::getValue(&local_88,&local_58);
      (this->fieldDefaultValue)._reader.dataSize = local_88._reader.dataSize;
      (this->fieldDefaultValue)._reader.pointerCount = local_88._reader.pointerCount;
      *(undefined2 *)&(this->fieldDefaultValue)._reader.field_0x26 = local_88._reader._38_2_;
      (this->fieldDefaultValue)._reader.nestingLimit = local_88._reader.nestingLimit;
      *(undefined4 *)&(this->fieldDefaultValue)._reader.field_0x2c = local_88._reader._44_4_;
      (this->fieldDefaultValue)._reader.data = local_88._reader.data;
      (this->fieldDefaultValue)._reader.pointers = local_88._reader.pointers;
      (this->fieldDefaultValue)._reader.segment = local_88._reader.segment;
      (this->fieldDefaultValue)._reader.capTable = local_88._reader.capTable;
    }
    bVar10 = Declaration::Reader::hasDocComment(decl);
    if (bVar10) {
      AVar12 = (ArrayPtr<const_char>)Declaration::Reader::getDocComment(decl);
      if ((this->docComment).ptr.isSet == true) {
        (this->docComment).ptr.isSet = false;
      }
      (this->docComment).ptr.field_1.value.super_StringPtr.content = AVar12;
      (this->docComment).ptr.isSet = true;
    }
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::compiler::Declaration::Which,capnp::compiler::Declaration::Which>&>
            ((Fault *)&local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
             ,0x42f,FAILED,"decl.which() == Declaration::FIELD","_kjCondition,",
             (DebugComparison<capnp::compiler::Declaration::Which,_capnp::compiler::Declaration::Which>
              *)local_b8);
  kj::_::Debug::Fault::fatal((Fault *)&local_88);
}

Assistant:

inline MemberInfo(MemberInfo& parent, uint codeOrder,
                      const Declaration::Reader& decl,
                      StructLayout::StructOrGroup& fieldScope,
                      bool isInUnion)
        : parent(&parent), codeOrder(codeOrder), isInUnion(isInUnion),
          name(decl.getName().getValue()), declId(decl.getId()), declKind(Declaration::FIELD),
          declAnnotations(decl.getAnnotations()),
          startByte(decl.getStartByte()), endByte(decl.getEndByte()),
          node(nullptr), sourceInfo(nullptr), fieldScope(&fieldScope) {
      KJ_REQUIRE(decl.which() == Declaration::FIELD);
      auto fieldDecl = decl.getField();
      fieldType = fieldDecl.getType();
      if (fieldDecl.getDefaultValue().isValue()) {
        hasDefaultValue = true;
        fieldDefaultValue = fieldDecl.getDefaultValue().getValue();
      }
      if (decl.hasDocComment()) {
        docComment = decl.getDocComment();
      }
    }